

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ApiCallback(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Fts5Auxiliary *pFVar1;
  i64 iCsrId;
  Fts5Cursor *pFVar2;
  char *z;
  
  pFVar1 = (Fts5Auxiliary *)context->pFunc->pUserData;
  iCsrId = sqlite3VdbeIntValue(*argv);
  pFVar2 = fts5CursorFromCsrid(pFVar1->pGlobal,iCsrId);
  if (pFVar2 != (Fts5Cursor *)0x0) {
    pFVar2->pAux = pFVar1;
    (*pFVar1->xFunc)(&sFts5Api,(Fts5Context *)pFVar2,context,argc + -1,argv + 1);
    pFVar2->pAux = (Fts5Auxiliary *)0x0;
    return;
  }
  z = sqlite3_mprintf("no such cursor: %lld",iCsrId);
  sqlite3_result_error(context,z,-1);
  sqlite3_free(z);
  return;
}

Assistant:

static void fts5ApiCallback(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){

  Fts5Auxiliary *pAux;
  Fts5Cursor *pCsr;
  i64 iCsrId;

  assert( argc>=1 );
  pAux = (Fts5Auxiliary*)sqlite3_user_data(context);
  iCsrId = sqlite3_value_int64(argv[0]);

  pCsr = fts5CursorFromCsrid(pAux->pGlobal, iCsrId);
  if( pCsr==0 ){
    char *zErr = sqlite3_mprintf("no such cursor: %lld", iCsrId);
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
  }else{
    fts5ApiInvoke(pAux, pCsr, context, argc-1, &argv[1]);
  }
}